

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_artifact_set_values(parser *p)

{
  errr eVar1;
  parser_error pVar2;
  char *str;
  int local_3c [2];
  wchar_t index;
  wchar_t value;
  _Bool found;
  char *t;
  char *s;
  set_item *e;
  artifact_set *set;
  parser *p_local;
  
  set = (artifact_set *)p;
  e = (set_item *)parser_priv(p);
  s = *(char **)(e->modifiers + 7);
  if (e == (set_item *)0x0) {
    __assert_fail("set",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-init.c"
                  ,0xd59,"enum parser_error parse_artifact_set_values(struct parser *)");
  }
  if (s == (char *)0x0) {
    __assert_fail("e",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-init.c"
                  ,0xd5a,"enum parser_error parse_artifact_set_values(struct parser *)");
  }
  str = parser_getstr((parser *)set,"values");
  t = string_make(str);
  _value = strtok(t," |");
  while (_value != (char *)0x0) {
    index._3_1_ = 0;
    local_3c[1] = 0;
    local_3c[0] = 0;
    eVar1 = grab_int_value((int16_t *)(s + 0x12),obj_mods,_value);
    if (eVar1 == 0) {
      index._3_1_ = 1;
    }
    eVar1 = grab_index_and_int(local_3c + 1,local_3c,element_names,"RES_",_value);
    if (eVar1 == 0) {
      index._3_1_ = 1;
      *(short *)(s + (long)local_3c[0] * 4 + 0x34) = 100 - (short)local_3c[1];
    }
    if ((index._3_1_ & 1) == 0) break;
    _value = strtok((char *)0x0," |");
  }
  mem_free(t);
  pVar2 = PARSE_ERROR_NONE;
  if (_value != (char *)0x0) {
    pVar2 = PARSE_ERROR_INVALID_VALUE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_artifact_set_values(struct parser *p) {
	struct artifact_set *set = parser_priv(p);
	struct set_item *e = set->set_item;
	char *s;
	char *t;
	assert(set);
	assert(e);

	s = string_make(parser_getstr(p, "values"));
	t = strtok(s, " |");

	while (t) {
		bool found = false;
		int value = 0;
		int index = 0;
		if (!grab_int_value(e->modifiers, obj_mods, t))
			found = true;
		if (!grab_index_and_int(&value, &index, element_names, "RES_", t)) {
			found = true;
			e->el_info[index].res_level = RES_LEVEL_BASE - value;
		}
		if (!found)
			break;

		t = strtok(NULL, " |");
	}

	mem_free(s);
	return t ? PARSE_ERROR_INVALID_VALUE : PARSE_ERROR_NONE;
}